

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O1

bool __thiscall QCacheItem::canCompress(QCacheItem *this)

{
  char cVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QHttpHeaders h;
  QNetworkCacheMetaData local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d.d.ptr = (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::headers(&local_40);
  bVar2 = false;
  QVar4 = QHttpHeaders::value((QHttpHeaders *)&local_40,ContentLength,(QByteArrayView)ZEXT816(0));
  if ((storage_type *)QVar4.m_size == (storage_type *)0x0) goto LAB_001d6617;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QVar3.m_data = (storage_type *)QVar4.m_size;
  QVar3.m_size = (qsizetype)&local_38;
  QtPrivate::toSignedInteger(QVar3,(int)QVar4.m_data);
  if ((((ulong)puStack_30 & 1) != 0) || ((long)local_38 < 0x300001)) {
    bVar2 = false;
    QVar4 = QHttpHeaders::value((QHttpHeaders *)&local_40,ContentType,(QByteArrayView)ZEXT816(0));
    if (QVar4.m_size != 0) goto LAB_001d6617;
    QVar5.m_data = "text/";
    QVar5.m_size = 5;
    cVar1 = QtPrivate::startsWith(QVar4,QVar5);
    if ((cVar1 != '\0') ||
       ((QVar6.m_data = "application/", QVar6.m_size = 0xc,
        cVar1 = QtPrivate::startsWith(QVar4,QVar6), cVar1 != '\0' &&
        ((QVar7.m_data = "javascript", QVar7.m_size = 10, cVar1 = QtPrivate::endsWith(QVar4,QVar7),
         cVar1 != '\0' ||
         (QVar8.m_data = "ecmascript", QVar8.m_size = 10, cVar1 = QtPrivate::endsWith(QVar4,QVar8),
         cVar1 != '\0')))))) {
      bVar2 = true;
      goto LAB_001d6617;
    }
  }
  bVar2 = false;
LAB_001d6617:
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QCacheItem::canCompress() const
{
    const auto h = metaData.headers();

    const auto sizeValue = h.value(QHttpHeaders::WellKnownHeader::ContentLength);
    if (sizeValue.empty())
        return false;

    qint64 size = sizeValue.toLongLong();
    if (size > MAX_COMPRESSION_SIZE)
        return false;

    const auto type = h.value(QHttpHeaders::WellKnownHeader::ContentType);
    if (!type.empty())
        return false;

    if (!type.startsWith("text/")
        && !(type.startsWith("application/")
            && (type.endsWith("javascript") || type.endsWith("ecmascript")))) {
        return false;
    }

    return true;
}